

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

void __thiscall OpenMD::Molecule::addCutoffGroup(Molecule *this,CutoffGroup *cp)

{
  pointer *pppCVar1;
  iterator __position;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  _Var2;
  CutoffGroup *local_10;
  
  local_10 = cp;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::CutoffGroup**,std::vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::CutoffGroup*const>>
                    ((this->cutoffGroups_).
                     super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->cutoffGroups_).
                     super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->cutoffGroups_).
       super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>>::
      _M_realloc_insert<OpenMD::CutoffGroup*const&>
                ((vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>> *)
                 &this->cutoffGroups_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppCVar1 = &(this->cutoffGroups_).
                  super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addCutoffGroup(CutoffGroup* cp) {
    if (std::find(cutoffGroups_.begin(), cutoffGroups_.end(), cp) ==
        cutoffGroups_.end()) {
      cutoffGroups_.push_back(cp);
    }
  }